

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O2

void __thiscall QStyleOptionViewItem::QStyleOptionViewItem(QStyleOptionViewItem *this,int version)

{
  QStyleOption::QStyleOption(&this->super_QStyleOption,version,10);
  this->displayAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x1;
  this->decorationAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x1;
  this->textElideMode = ElideMiddle;
  this->decorationPosition = Left;
  (this->decorationSize).wd = -1;
  (this->decorationSize).ht = -1;
  QFont::QFont(&this->font);
  this->showDecorationSelected = false;
  (this->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
  super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i = 0;
  QLocale::QLocale(&this->locale);
  this->widget = (QWidget *)0x0;
  (this->index).r = -1;
  (this->index).c = -1;
  (this->index).i = 0;
  (this->index).m.ptr = (QAbstractItemModel *)0x0;
  this->checkState = Unchecked;
  QIcon::QIcon(&this->icon);
  *(undefined8 *)((long)&(this->text).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->text).d.size + 4) = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  QBrush::QBrush(&this->backgroundBrush);
  return;
}

Assistant:

QStyleOptionViewItem::QStyleOptionViewItem(int version)
    : QStyleOption(version, SO_ViewItem),
      displayAlignment(Qt::AlignLeft), decorationAlignment(Qt::AlignLeft),
      textElideMode(Qt::ElideMiddle), decorationPosition(Left),
      showDecorationSelected(false), features(None), widget(nullptr),
      checkState(Qt::Unchecked), viewItemPosition(QStyleOptionViewItem::Invalid)
{
}